

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O1

Result __thiscall
wabt::SharedValidator::OnElemSegmentElemType(SharedValidator *this,Location *loc,Type elem_type)

{
  pointer pEVar1;
  Enum EVar2;
  Result RVar3;
  
  pEVar1 = (this->elems_).
           super__Vector_base<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  EVar2 = Ok;
  if (pEVar1[-1].is_active == true) {
    RVar3 = CheckType(this,loc,elem_type,pEVar1[-1].table_type,"elem segment");
    EVar2 = (Enum)(RVar3.enum_ == Error);
  }
  pEVar1[-1].element = elem_type;
  return (Result)EVar2;
}

Assistant:

Result SharedValidator::OnElemSegmentElemType(const Location& loc,
                                              Type elem_type) {
  Result result = Result::Ok;
  auto& elem = elems_.back();
  if (elem.is_active) {
    // Check that the type of the elem segment matches the table in which
    // it is active.
    result |= CheckType(loc, elem_type, elem.table_type, "elem segment");
  }
  elem.element = elem_type;
  return result;
}